

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampTest::verifyImage
          (TextureBorderClampTest *this,Surface *renderedFrame,IterationConfig *config,
          ReferenceParams *samplerParams)

{
  PixelFormat *pPVar1;
  int *piVar2;
  Sampler *pSVar3;
  float afVar4 [2];
  ostringstream *poVar5;
  pointer *ppCVar6;
  float fVar7;
  int iVar8;
  int iVar9;
  FilterMode FVar10;
  FilterMode FVar11;
  Texture2D *pTVar12;
  TestLog *pTVar13;
  float t;
  int s;
  undefined4 t_00;
  pointer pfVar14;
  bool bVar15;
  int i;
  int iVar16;
  uint uVar17;
  RenderTarget *pRVar18;
  long lVar19;
  TextureFormat TVar20;
  IVec2 (*paIVar21) [4];
  ulong uVar22;
  char *pcVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  ConstPixelBufferAccess *pCVar28;
  Surface *pSVar29;
  float fVar30;
  uint uVar31;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  int iVar32;
  void *pvVar33;
  pointer data;
  int iVar34;
  int iVar35;
  TextureBorderClampTest *pTVar36;
  bool bVar37;
  Texture2DView TVar38;
  Vec2 viewportCoord;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  TextureBorderClampTest *local_470;
  Vec2 texCoords [4];
  int local_440;
  Vec2 texCoord_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  Vector<bool,_4> res_5;
  float fStack_40c;
  void *local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400;
  Surface errorMask;
  Surface reference;
  Vec2 texCoords_1 [4];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Texture2DView effectiveView;
  size_type __dnew_1;
  ConstPixelBufferAccess *pCStack_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  _Alloc_hider local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308 [6];
  int local_29c;
  PixelFormat pixelFormat;
  void *local_288;
  IVec4 nonShadowBits;
  undefined1 local_268 [32];
  void *pvStack_248;
  BVec4 local_240;
  ConstPixelBufferAccess local_238;
  Vec3 nonShadowThreshold;
  LodPrecision lowQualityLodPrecision;
  LodPrecision lodPrecision;
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Alloc_hider local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [4];
  ios_base local_160 [264];
  vector<float,_std::allocator<float>_> texCoord;
  
  local_470 = this;
  pRVar18 = Context::getRenderTarget((this->super_TestCase).m_context);
  pPVar1 = &pRVar18->m_pixelFormat;
  iVar16 = pPVar1->redBits;
  iVar32 = (pRVar18->m_pixelFormat).greenBits;
  piVar2 = &(pRVar18->m_pixelFormat).blueBits;
  iVar8 = *piVar2;
  iVar9 = (pRVar18->m_pixelFormat).alphaBits;
  pCVar28 = *(ConstPixelBufferAccess **)piVar2;
  lodPrecision.rule = RULE_OPENGL;
  lodPrecision.derivateBits = 0x16;
  lodPrecision.lodBits = 0x10;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  glu::TextureTestUtil::computeQuadTexCoord2D(&texCoord,&config->p0,&config->p1);
  pTVar36 = local_470;
  lodPrecision.derivateBits = 0x12;
  lodPrecision.lodBits = 5;
  if ((samplerParams->sampler).compare == COMPAREMODE_NONE) {
    TVar20 = tcu::getEffectiveDepthStencilTextureFormat
                       ((TextureFormat *)
                        &((local_470->m_texture).
                          super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.
                          m_data.ptr)->m_refTexture,local_470->m_sampleMode);
    FVar10 = (samplerParams->sampler).minFilter;
    FVar11 = (samplerParams->sampler).magFilter;
    __dnew_1._0_4_ = pPVar1->redBits;
    __dnew_1._4_4_ = pPVar1->greenBits;
    pCStack_330 = pCVar28;
    lVar19 = 0;
    do {
      *(uint *)(local_268 + lVar19 * 4) =
           2 - (uint)((TVar20.order & ~A) != sRGB &&
                     ((FVar10 & ~NEAREST_MIPMAP_NEAREST) == NEAREST && FVar11 == NEAREST));
      lVar19 = lVar19 + 1;
    } while (lVar19 != 4);
    res.m_data[0] = 0;
    res.m_data[1] = 0;
    res.m_data[2] = 0;
    res.m_data[3] = 0;
    lVar19 = 0;
    do {
      res.m_data[lVar19] = *(int *)((long)&__dnew_1 + lVar19 * 4) - *(int *)(local_268 + lVar19 * 4)
      ;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 4);
    local_238.m_format.order = R;
    local_238.m_format.type = SNORM_INT8;
    local_238.m_size.m_data[0] = 0;
    local_238.m_size.m_data[1] = 0;
    nonShadowBits.m_data[0] = 0;
    nonShadowBits.m_data[1] = 0;
    nonShadowBits.m_data[2] = 0;
    nonShadowBits.m_data[3] = 0;
    lVar19 = 0;
    do {
      iVar35 = local_238.m_size.m_data[lVar19 + -2];
      if (iVar35 < res.m_data[lVar19]) {
        iVar35 = res.m_data[lVar19];
      }
      nonShadowBits.m_data[lVar19] = iVar35;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 4);
    lVar19 = 0;
    do {
      *(undefined4 *)(local_268 + lVar19 * 4) = 0x16;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    lVar19 = 3;
    do {
      *(undefined4 *)(local_268 + lVar19 * 4) = 0x10;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 6);
    local_268._24_4_ = 0.0;
    local_268._28_4_ = 0.0;
    pvStack_248 = (void *)0x0;
    local_240.m_data[0] = true;
    local_240.m_data[1] = true;
    local_240.m_data[2] = true;
    local_240.m_data[3] = true;
    tcu::computeFixedPointThreshold((tcu *)&__dnew_1,&nonShadowBits);
    res.m_data[0] = 0;
    res.m_data[1] = 0;
    res.m_data[2] = 0;
    res.m_data[3] = 0;
    lVar19 = 0;
    do {
      res.m_data[lVar19] =
           (int)(*(float *)((long)&__dnew_1 + lVar19 * 4) /
                (samplerParams->super_RenderParams).colorScale.m_data[lVar19]);
      lVar19 = lVar19 + 1;
    } while (lVar19 != 4);
    local_268._28_4_ = res.m_data[1];
    local_268._24_4_ = res.m_data[0];
    pvStack_248 = (void *)CONCAT44(res.m_data[3],res.m_data[2]);
    local_268._0_4_ = DS;
    local_268._4_4_ = SIGNED_INT_1010102_REV;
    local_268._8_4_ = 0;
    local_268._12_4_ = 5;
    local_268._16_4_ = 5;
    local_268._20_4_ = 0;
    local_240.m_data[1] = 0 < iVar32;
    local_240.m_data[0] = 0 < iVar16;
    local_240.m_data[2] = 0 < iVar8;
    local_240.m_data[3] = 0 < iVar9;
    if (pTVar36->m_samplingFunction == SAMPLE_GATHER) {
      res.m_data[0] = 8;
      res.m_data[1] = 3;
      pvVar33 = (void *)(renderedFrame->m_pixels).m_cap;
      if (pvVar33 != (void *)0x0) {
        pvVar33 = (renderedFrame->m_pixels).m_ptr;
      }
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&local_238,(TextureFormat *)&res,renderedFrame->m_width,renderedFrame->m_height,1,
                 pvVar33);
      texCoords_1[0].m_data =
           *(float (*) [2])
            texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
      texCoords_1[1].m_data =
           *(float (*) [2])
            (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start + 2);
      texCoords_1[2].m_data =
           *(float (*) [2])
            (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start + 4);
      texCoords_1[3].m_data =
           *(float (*) [2])
            (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start + 6);
      pRVar18 = Context::getRenderTarget((pTVar36->super_TestCase).m_context);
      iVar16 = (pRVar18->m_pixelFormat).redBits;
      iVar32 = (pRVar18->m_pixelFormat).greenBits;
      iVar8 = (pRVar18->m_pixelFormat).blueBits;
      iVar9 = (pRVar18->m_pixelFormat).alphaBits;
      srcLevelStorage.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      srcLevelStorage.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      srcLevelStorage.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_6_ = 0;
      srcLevelStorage.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ = 0;
      pTVar12 = (pTVar36->m_texture).
                super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr;
      res.m_data[0] = (pTVar12->m_refTexture).m_view.m_numLevels;
      pCVar28 = (pTVar12->m_refTexture).m_view.m_levels;
      res.m_data[2] = (int)pCVar28;
      res.m_data[3] = (int)((ulong)pCVar28 >> 0x20);
      pSVar3 = &samplerParams->sampler;
      TVar38 = tcu::getEffectiveTextureView((Texture2DView *)&res,&srcLevelStorage,pSVar3);
      pixelFormat._8_8_ = TVar38.m_levels;
      pixelFormat.redBits = TVar38.m_numLevels;
      tcu::Surface::Surface(&reference,local_238.m_size.m_data[0],local_238.m_size.m_data[1]);
      tcu::Surface::Surface(&errorMask,local_238.m_size.m_data[0],local_238.m_size.m_data[1]);
      __dnew_1 = 0x300000008;
      if (errorMask.m_pixels.m_cap != 0) {
        errorMask.m_pixels.m_cap = (size_t)errorMask.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&res,(TextureFormat *)&__dnew_1,errorMask.m_width,
                 errorMask.m_height,1,(void *)errorMask.m_pixels.m_cap);
      texCoords[0].m_data[0] = -1.7146522e+38;
      tcu::RGBA::toVec((RGBA *)&__dnew_1);
      tcu::clear((PixelBufferAccess *)&res,(Vec4 *)&__dnew_1);
      if (reference.m_height < 1) {
        local_440 = 0;
      }
      else {
        iVar35 = 0;
        local_440 = 0;
        do {
          if (0 < reference.m_width) {
            iVar34 = 0;
            do {
              __dnew_1 = CONCAT44((float)iVar35,(float)iVar34);
              lVar19 = 0;
              do {
                texCoords[0].m_data[lVar19] = 0.5;
                lVar19 = lVar19 + 1;
              } while (lVar19 == 1);
              res.m_data[0] = 0;
              res.m_data[1] = 0;
              lVar19 = 0;
              do {
                res.m_data[lVar19] =
                     (int)(*(float *)((long)&__dnew_1 + lVar19 * 4) + texCoords[0].m_data[lVar19]);
                lVar19 = lVar19 + 1;
              } while (lVar19 == 1);
              viewportCoord.m_data[1] = (float)reference.m_height;
              viewportCoord.m_data[0] = (float)reference.m_width;
              _res_5 = (pointer)0x0;
              lVar19 = 0;
              do {
                *(float *)(&res_5)[lVar19].m_data =
                     (float)res.m_data[lVar19] / viewportCoord.m_data[lVar19];
                lVar19 = lVar19 + 1;
              } while (lVar19 == 1);
              Functional::(anonymous_namespace)::triQuadInterpolate<tcu::Vector<float,2>>
                        ((_anonymous_namespace_ *)&effectiveView,&texCoords_1,(float)res_5.m_data,
                         fStack_40c);
              t_00 = effectiveView._4_4_;
              s = effectiveView.m_numLevels;
              paIVar21 = glu::getDefaultGatherOffsets();
              tcu::gatherArray2DOffsets
                        ((tcu *)&res,(ConstPixelBufferAccess *)pixelFormat._8_8_,pSVar3,(float)s,
                         (float)t_00,0,0,paIVar21);
              texCoords[0].m_data[0] = 0.0;
              texCoords[0].m_data[1] = 0.0;
              texCoords[1].m_data[0] = 0.0;
              texCoords[1].m_data[1] = 0.0;
              lVar19 = 0;
              do {
                texCoords[0].m_data[lVar19] =
                     (float)res.m_data[lVar19] *
                     (samplerParams->super_RenderParams).colorScale.m_data[lVar19];
                lVar19 = lVar19 + 1;
              } while (lVar19 != 4);
              __dnew_1 = 0;
              pCStack_330 = (ConstPixelBufferAccess *)0x0;
              lVar19 = 0;
              do {
                *(float *)((long)&__dnew_1 + lVar19 * 4) =
                     texCoords[0].m_data[lVar19] +
                     (samplerParams->super_RenderParams).colorBias.m_data[lVar19];
                lVar19 = lVar19 + 1;
              } while (lVar19 != 4);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)texCoords,(int)&local_238,iVar34,iVar35);
              texCoord_1.m_data[0] = 0.0;
              texCoord_1.m_data[1] = 0.0;
              lVar19 = 0;
              do {
                texCoord_1.m_data[lVar19] =
                     texCoords[0].m_data[lVar19] -
                     (samplerParams->super_RenderParams).colorBias.m_data[lVar19];
                lVar19 = lVar19 + 1;
              } while (lVar19 != 4);
              viewportCoord.m_data[0] = 0.0;
              viewportCoord.m_data[1] = 0.0;
              lVar19 = 0;
              do {
                viewportCoord.m_data[lVar19] =
                     texCoord_1.m_data[lVar19] /
                     (samplerParams->super_RenderParams).colorScale.m_data[lVar19];
                lVar19 = lVar19 + 1;
              } while (lVar19 != 4);
              uVar17 = 0;
              uVar31 = 0;
              if (iVar16 != 0) {
                uVar24 = 0x7e - (res.m_data[0] >> 0x17);
                uVar31 = ((res.m_data[0] & 0x7fffffU) * 0xff + 0x7f800000 >> ((byte)uVar24 & 0x1f))
                         + 0x800000;
                if (8 < uVar24) {
                  uVar31 = uVar24;
                }
                uVar31 = uVar31 >> 0x18;
              }
              if (iVar32 != 0) {
                uVar24 = 0x7e - (res.m_data[1] >> 0x17);
                uVar17 = ((res.m_data[1] & 0x7fffffU) * 0xff + 0x7f800000 >> ((byte)uVar24 & 0x1f))
                         + 0x800000;
                if (8 < uVar24) {
                  uVar17 = uVar24;
                }
                uVar17 = uVar17 >> 0x10 & 0xff00;
              }
              if (iVar8 == 0) {
                uVar24 = 0;
              }
              else {
                uVar25 = 0x7e - (res.m_data[2] >> 0x17);
                uVar24 = ((res.m_data[2] & 0x7fffffU) * 0xff + 0x7f800000 >> ((byte)uVar25 & 0x1f))
                         + 0x800000;
                if (8 < uVar25) {
                  uVar24 = uVar25;
                }
                uVar24 = uVar24 >> 8 & 0xff0000;
              }
              if (iVar9 == 0) {
                uVar25 = 0xff000000;
              }
              else {
                uVar26 = 0x7e - (res.m_data[3] >> 0x17);
                uVar25 = ((res.m_data[3] & 0x7fffffU) * 0xff + 0x7f800000 >> ((byte)uVar26 & 0x1f))
                         + 0x800000;
                if (8 < uVar26) {
                  uVar25 = uVar26;
                }
                uVar25 = uVar25 & 0xff000000;
              }
              *(uint *)((long)reference.m_pixels.m_ptr +
                       (long)(reference.m_width * iVar35 + iVar34) * 4) =
                   uVar17 | uVar31 | uVar24 | uVar25;
              texCoord_1.m_data[0] = 0.0;
              texCoord_1.m_data[1] = 0.0;
              lVar19 = 0;
              do {
                fVar30 = texCoords[0].m_data[lVar19];
                fVar7 = *(float *)((long)&__dnew_1 + lVar19 * 4);
                texCoord_1.m_data[lVar19] =
                     (float)(~-(uint)(fVar7 < fVar30) & (uint)(fVar7 - fVar30) |
                            (uint)(fVar30 - fVar7) & -(uint)(fVar7 < fVar30));
                lVar19 = lVar19 + 1;
              } while (lVar19 != 4);
              lowQualityLodPrecision._0_8_ = lowQualityLodPrecision._0_8_ & 0xffffffff00000000;
              lVar19 = 0;
              do {
                *(bool *)((long)&lowQualityLodPrecision.rule + lVar19) =
                     *(float *)(local_268 + lVar19 * 4 + 0x18) <= texCoord_1.m_data[lVar19] &&
                     texCoord_1.m_data[lVar19] != *(float *)(local_268 + lVar19 * 4 + 0x18);
                lVar19 = lVar19 + 1;
              } while (lVar19 != 4);
              nonShadowThreshold.m_data._0_8_ = nonShadowThreshold.m_data._0_8_ & 0xffffffff00000000
              ;
              lVar19 = 0;
              do {
                *(byte *)((long)nonShadowThreshold.m_data + lVar19) =
                     *(byte *)((long)&lowQualityLodPrecision.rule + lVar19) &
                     local_240.m_data[lVar19];
                lVar19 = lVar19 + 1;
              } while (lVar19 != 4);
              if (nonShadowThreshold.m_data[0]._0_1_ == '\0') {
                uVar22 = 0xffffffffffffffff;
                do {
                  if (uVar22 == 2) {
                    uVar27 = 3;
                    break;
                  }
                  uVar27 = uVar22 + 1;
                  lVar19 = uVar22 + 2;
                  uVar22 = uVar27;
                } while (*(char *)((long)nonShadowThreshold.m_data + lVar19) != '\x01');
                if (uVar27 < 3) goto LAB_015171e1;
              }
              else {
LAB_015171e1:
                paIVar21 = glu::getDefaultGatherOffsets();
                bVar37 = tcu::isGatherOffsetsResultValid
                                   ((Texture2DView *)&pixelFormat,pSVar3,
                                    (LookupPrecision *)local_268,(Vec2 *)&effectiveView,0,paIVar21,
                                    (Vec4 *)&viewportCoord);
                if (!bVar37) {
                  *(undefined4 *)
                   ((long)errorMask.m_pixels.m_ptr + (long)(errorMask.m_width * iVar35 + iVar34) * 4
                   ) = 0xff0000ff;
                  local_440 = local_440 + 1;
                }
              }
              iVar34 = iVar34 + 1;
            } while (iVar34 < reference.m_width);
          }
          iVar35 = iVar35 + 1;
        } while (iVar35 < reference.m_height);
      }
      pTVar36 = local_470;
      if (0 < local_440) {
        pTVar13 = ((local_470->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar5 = (ostringstream *)(res.m_data + 2);
        res.m_data[0] = (int)pTVar13;
        res.m_data[1] = (int)((ulong)pTVar13 >> 0x20);
        std::__cxx11::ostringstream::ostringstream(poVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,"ERROR: Result verification failed, got ",0x27);
        std::ostream::operator<<(poVar5,local_440);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5," invalid pixels!",0x10);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar5);
        std::ios_base::~ios_base(local_160);
      }
      pTVar13 = ((pTVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      afVar4 = (float  [2])(texCoords + 2);
      texCoords[2].m_data[0] = 1.8314912e+25;
      texCoords[2].m_data[1] = 6.2121023e+22;
      texCoords[1].m_data[0] = 1.68156e-44;
      texCoords[1].m_data[1] = 0.0;
      texCoords[3].m_data._0_5_ = 0x746c7573;
      viewportCoord.m_data = (float  [2])&local_488;
      res.m_data[0] = 0x13;
      res.m_data[1] = 0;
      texCoords[0].m_data = afVar4;
      viewportCoord.m_data =
           (float  [2])std::__cxx11::string::_M_create((ulong *)&viewportCoord,(ulong)&res);
      local_488._M_allocated_capacity = CONCAT44(res.m_data[1],res.m_data[0]);
      *(undefined8 *)viewportCoord.m_data = 0x6163696669726556;
      builtin_strncpy((char *)((long)viewportCoord.m_data + 8),"tion res",8);
      builtin_strncpy((char *)((long)viewportCoord.m_data + 0xf),"sult",4);
      *(char *)((long)viewportCoord.m_data + local_488._M_allocated_capacity) = '\0';
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)&__dnew_1,(string *)texCoords,(string *)&viewportCoord);
      tcu::TestLog::startImageSet(pTVar13,(char *)__dnew_1,local_318._M_p);
      local_428._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_428._M_allocated_capacity._6_2_ = 0x6465;
      local_428._M_local_buf[8] = '\0';
      local_400._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_400._M_allocated_capacity._6_2_ = 0x6465;
      local_400._M_local_buf[8] = ' ';
      local_400._M_local_buf[9] = 'i';
      local_400._10_4_ = 0x6567616d;
      local_400._M_local_buf[0xe] = '\0';
      pCVar28 = &local_238;
      texCoord_1.m_data = (float  [2])&local_428;
      _res_5 = (pointer)&local_400;
      tcu::LogImage::LogImage
                ((LogImage *)&res,(string *)&texCoord_1,(string *)&res_5,pCVar28,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&res,(int)pTVar13,__buf_08,(size_t)pCVar28);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_p != local_1a8) {
        operator_delete(local_1b8._M_p,local_1a8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(res.m_data[1],res.m_data[0]) != &local_1c8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(res.m_data[1],res.m_data[0]),local_1c8._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_res_5 != &local_400) {
        operator_delete(_res_5,CONCAT26(local_400._M_allocated_capacity._6_2_,
                                        local_400._M_allocated_capacity._0_6_) + 1);
      }
      if (texCoord_1.m_data != (float  [2])&local_428) {
        operator_delete((void *)texCoord_1.m_data,
                        CONCAT26(local_428._M_allocated_capacity._6_2_,
                                 local_428._M_allocated_capacity._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_p != local_308) {
        operator_delete(local_318._M_p,local_308[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__dnew_1 != &local_328) {
        operator_delete((void *)__dnew_1,local_328._M_allocated_capacity + 1);
      }
      if (viewportCoord.m_data != (float  [2])&local_488) {
        operator_delete((void *)viewportCoord.m_data,local_488._M_allocated_capacity + 1);
      }
      if (texCoords[0].m_data != afVar4) {
        operator_delete((void *)texCoords[0].m_data,(long)texCoords[2].m_data + 1);
      }
      if (0 < local_440) {
        pTVar13 = ((local_470->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        texCoords[2].m_data[0] = 6.8000833e+22;
        texCoords[2].m_data[1] = 4.397635e+21;
        texCoords[3].m_data[0]._0_2_ = 0x65;
        texCoords[1].m_data[0] = 1.26117e-44;
        texCoords[1].m_data[1] = 0.0;
        viewportCoord.m_data = (float  [2])&local_488;
        __dnew_1 = 0x15;
        texCoords[0].m_data = afVar4;
        viewportCoord.m_data =
             (float  [2])std::__cxx11::string::_M_create((ulong *)&viewportCoord,(ulong)&__dnew_1);
        local_488._M_allocated_capacity = __dnew_1;
        *(undefined8 *)viewportCoord.m_data = 0x6572206c61656449;
        builtin_strncpy((char *)((long)viewportCoord.m_data + 8),"ference ",8);
        builtin_strncpy((char *)((long)viewportCoord.m_data + 0xd),"ce image",8);
        *(char *)((long)viewportCoord.m_data + __dnew_1) = '\0';
        pSVar29 = &reference;
        tcu::LogImage::LogImage
                  ((LogImage *)&res,(string *)texCoords,(string *)&viewportCoord,pSVar29,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        iVar16 = (int)pTVar13;
        tcu::LogImage::write((LogImage *)&res,iVar16,__buf_09,(size_t)pSVar29);
        local_428._M_allocated_capacity._0_6_ = 0x4d726f727245;
        local_428._M_allocated_capacity._6_2_ = 0x7361;
        local_428._M_local_buf[8] = 'k';
        local_428._M_local_buf[9] = '\0';
        local_400._M_allocated_capacity._0_6_ = 0x20726f727245;
        local_400._M_allocated_capacity._6_2_ = 0x616d;
        local_400._M_local_buf[8] = 's';
        local_400._M_local_buf[9] = 'k';
        local_400._10_4_ = local_400._10_4_ & 0xffffff00;
        pSVar29 = &errorMask;
        texCoord_1.m_data = (float  [2])&local_428;
        _res_5 = (pointer)&local_400;
        tcu::LogImage::LogImage
                  ((LogImage *)&__dnew_1,(string *)&texCoord_1,(string *)&res_5,pSVar29,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&__dnew_1,iVar16,__buf_10,(size_t)pSVar29);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_p != local_308) {
          operator_delete(local_318._M_p,local_308[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__dnew_1 != &local_328) {
          operator_delete((void *)__dnew_1,local_328._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_res_5 != &local_400) {
          operator_delete(_res_5,CONCAT26(local_400._M_allocated_capacity._6_2_,
                                          local_400._M_allocated_capacity._0_6_) + 1);
        }
        if (texCoord_1.m_data != (float  [2])&local_428) {
          operator_delete((void *)texCoord_1.m_data,
                          CONCAT26(local_428._M_allocated_capacity._6_2_,
                                   local_428._M_allocated_capacity._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_p != local_1a8) {
          operator_delete(local_1b8._M_p,local_1a8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(res.m_data[1],res.m_data[0]) != &local_1c8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(res.m_data[1],res.m_data[0]),
                          local_1c8._M_allocated_capacity + 1);
        }
        if (viewportCoord.m_data != (float  [2])&local_488) {
          operator_delete((void *)viewportCoord.m_data,local_488._M_allocated_capacity + 1);
        }
        if (texCoords[0].m_data != afVar4) {
          operator_delete((void *)texCoords[0].m_data,(long)texCoords[2].m_data + 1);
        }
      }
      tcu::TestLog::endImageSet
                (((local_470->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
      tcu::Surface::~Surface(&errorMask);
      tcu::Surface::~Surface(&reference);
      if (srcLevelStorage.
          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(srcLevelStorage.
                        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        CONCAT26(srcLevelStorage.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_,
                                 srcLevelStorage.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_6_) -
                        (long)srcLevelStorage.
                              super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar37 = local_440 == 0;
    }
    else if (pTVar36->m_samplingFunction == SAMPLE_FILTER) {
      res.m_data[0] = 8;
      res.m_data[1] = 3;
      pvVar33 = (void *)(renderedFrame->m_pixels).m_cap;
      if (pvVar33 != (void *)0x0) {
        pvVar33 = (renderedFrame->m_pixels).m_ptr;
      }
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&local_238,(TextureFormat *)&res,renderedFrame->m_width,renderedFrame->m_height,1,
                 pvVar33);
      pfVar14 = texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      pRVar18 = Context::getRenderTarget((local_470->super_TestCase).m_context);
      reference.m_width = (pRVar18->m_pixelFormat).redBits;
      reference.m_height = (pRVar18->m_pixelFormat).greenBits;
      reference.m_pixels.m_ptr = *(void **)&(pRVar18->m_pixelFormat).blueBits;
      tcu::Surface::Surface((Surface *)&res_5,local_238.m_size.m_data[0],local_238.m_size.m_data[1])
      ;
      tcu::Surface::Surface
                ((Surface *)&srcLevelStorage,local_238.m_size.m_data[0],local_238.m_size.m_data[1]);
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)&res,(Surface *)&res_5,(PixelFormat *)&reference);
      pTVar12 = (local_470->m_texture).
                super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr;
      pCStack_330 = (pTVar12->m_refTexture).m_view.m_levels;
      __dnew_1 = CONCAT44(__dnew_1._4_4_,(pTVar12->m_refTexture).m_view.m_numLevels);
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)&res,(Texture2DView *)&__dnew_1,pfVar14,samplerParams);
      __dnew_1 = 0x300000008;
      pvVar33 = (void *)CONCAT26(local_400._M_allocated_capacity._6_2_,
                                 local_400._M_allocated_capacity._0_6_);
      if ((void *)CONCAT26(local_400._M_allocated_capacity._6_2_,
                           local_400._M_allocated_capacity._0_6_) != (void *)0x0) {
        pvVar33 = local_408;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&res,(TextureFormat *)&__dnew_1,(int)res_5.m_data,
                 (int)fStack_40c,1,pvVar33);
      texCoords_1[0].m_data[0] = 1.12104e-44;
      texCoords_1[0].m_data[1] = 4.2039e-45;
      data = (pointer)CONCAT26(srcLevelStorage.
                               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_,
                               srcLevelStorage.
                               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_6_);
      if ((pointer)CONCAT26(srcLevelStorage.
                            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_,
                            srcLevelStorage.
                            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_6_) !=
          (pointer)0x0) {
        data = srcLevelStorage.
               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&__dnew_1,(TextureFormat *)texCoords_1,
                 (int)srcLevelStorage.
                      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                 srcLevelStorage.
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start._4_4_,1,data);
      pTVar36 = local_470;
      pTVar12 = (local_470->m_texture).
                super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr;
      texCoords_1[1].m_data = (float  [2])(pTVar12->m_refTexture).m_view.m_levels;
      texCoords_1[0].m_data[0] = (float)(pTVar12->m_refTexture).m_view.m_numLevels;
      iVar16 = glu::TextureTestUtil::computeTextureLookupDiff
                         (&local_238,(ConstPixelBufferAccess *)&res,(PixelBufferAccess *)&__dnew_1,
                          (Texture2DView *)texCoords_1,pfVar14,samplerParams,
                          (LookupPrecision *)local_268,&lodPrecision,
                          ((local_470->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                          m_watchDog);
      if (0 < iVar16) {
        pTVar13 = ((pTVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar5 = (ostringstream *)(res.m_data + 2);
        res.m_data[0] = (int)pTVar13;
        res.m_data[1] = (int)((ulong)pTVar13 >> 0x20);
        std::__cxx11::ostringstream::ostringstream(poVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,"ERROR: Result verification failed, got ",0x27);
        std::ostream::operator<<(poVar5,iVar16);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5," invalid pixels!",0x10);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar5);
        std::ios_base::~ios_base(local_160);
      }
      pTVar13 = ((pTVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      texCoords_1[0].m_data = (float  [2])(texCoords_1 + 2);
      texCoords_1[2].m_data[0] = 1.8314912e+25;
      texCoords_1[2].m_data[1] = 6.2121023e+22;
      texCoords_1[1].m_data[0] = 1.68156e-44;
      texCoords_1[1].m_data[1] = 0.0;
      texCoords_1[3].m_data._0_5_ = 0x746c7573;
      texCoords[0].m_data = (float  [2])(texCoords + 2);
      res.m_data[0] = 0x13;
      res.m_data[1] = 0;
      texCoords[0].m_data =
           (float  [2])std::__cxx11::string::_M_create((ulong *)texCoords,(ulong)&res);
      texCoords[1].m_data[1] = (float)res.m_data[1];
      texCoords[1].m_data[0] = (float)res.m_data[0];
      *(undefined8 *)texCoords[0].m_data = 0x6163696669726556;
      builtin_strncpy((char *)((long)texCoords[0].m_data + 8),"tion res",8);
      builtin_strncpy((char *)((long)texCoords[0].m_data + 0xf),"sult",4);
      *(char *)((long)texCoords[0].m_data + (long)texCoords[1].m_data) = '\0';
      texCoords[2].m_data = texCoords[1].m_data;
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)&__dnew_1,(string *)texCoords_1,(string *)texCoords);
      tcu::TestLog::startImageSet(pTVar13,(char *)__dnew_1,local_318._M_p);
      local_488._M_allocated_capacity = 0x64657265646e6552;
      local_488._8_4_ = local_488._8_4_ & 0xffffff00;
      local_428._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_428._M_allocated_capacity._6_2_ = 0x6465;
      local_428._M_local_buf[8] = ' ';
      local_428._M_local_buf[9] = 'i';
      local_428._10_4_ = 0x6567616d;
      local_428._M_local_buf[0xe] = '\0';
      pCVar28 = &local_238;
      viewportCoord.m_data = (float  [2])&local_488;
      texCoord_1.m_data = (float  [2])&local_428;
      tcu::LogImage::LogImage
                ((LogImage *)&res,(string *)&viewportCoord,(string *)&texCoord_1,pCVar28,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&res,(int)pTVar13,__buf,(size_t)pCVar28);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_p != local_1a8) {
        operator_delete(local_1b8._M_p,local_1a8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(res.m_data[1],res.m_data[0]) != &local_1c8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(res.m_data[1],res.m_data[0]),local_1c8._M_allocated_capacity + 1
                       );
      }
      if (texCoord_1.m_data != (float  [2])&local_428) {
        operator_delete((void *)texCoord_1.m_data,
                        CONCAT26(local_428._M_allocated_capacity._6_2_,
                                 local_428._M_allocated_capacity._0_6_) + 1);
      }
      if (viewportCoord.m_data != (float  [2])&local_488) {
        operator_delete((void *)viewportCoord.m_data,local_488._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_p != local_308) {
        operator_delete(local_318._M_p,local_308[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__dnew_1 != &local_328) {
        operator_delete((void *)__dnew_1,local_328._M_allocated_capacity + 1);
      }
      if (texCoords[0].m_data != (float  [2])(texCoords + 2)) {
        operator_delete((void *)texCoords[0].m_data,(long)texCoords[2].m_data + 1);
      }
      if (texCoords_1[0].m_data != (float  [2])(texCoords_1 + 2)) {
        operator_delete((void *)texCoords_1[0].m_data,(long)texCoords_1[2].m_data + 1);
      }
      if (0 < iVar16) {
        pTVar13 = ((local_470->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        texCoords_1[0].m_data = (float  [2])(texCoords_1 + 2);
        texCoords_1[2].m_data[0] = 6.8000833e+22;
        texCoords_1[2].m_data[1] = 4.397635e+21;
        texCoords_1[3].m_data[0]._0_2_ = 0x65;
        texCoords_1[1].m_data[0] = 1.26117e-44;
        texCoords_1[1].m_data[1] = 0.0;
        texCoords[0].m_data = (float  [2])(texCoords + 2);
        __dnew_1 = 0x15;
        texCoords[0].m_data =
             (float  [2])std::__cxx11::string::_M_create((ulong *)texCoords,(ulong)&__dnew_1);
        texCoords[2].m_data[0] = (float)(undefined4)__dnew_1;
        texCoords[2].m_data[1] = (float)__dnew_1._4_4_;
        *(undefined8 *)texCoords[0].m_data = 0x6572206c61656449;
        builtin_strncpy((char *)((long)texCoords[0].m_data + 8),"ference ",8);
        builtin_strncpy((char *)((long)texCoords[0].m_data + 0xd),"ce image",8);
        texCoords[1].m_data[0] = (float)(undefined4)__dnew_1;
        texCoords[1].m_data[1] = (float)__dnew_1._4_4_;
        *(char *)((long)texCoords[0].m_data + __dnew_1) = '\0';
        pSVar29 = (Surface *)&res_5;
        tcu::LogImage::LogImage
                  ((LogImage *)&res,(string *)texCoords_1,(string *)texCoords,pSVar29,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        iVar32 = (int)pTVar13;
        tcu::LogImage::write((LogImage *)&res,iVar32,__buf_00,(size_t)pSVar29);
        local_488._M_allocated_capacity = 0x73614d726f727245;
        local_488._8_2_ = 0x6b;
        local_428._M_allocated_capacity._0_6_ = 0x20726f727245;
        local_428._M_allocated_capacity._6_2_ = 0x616d;
        local_428._M_local_buf[8] = 's';
        local_428._M_local_buf[9] = 'k';
        local_428._10_4_ = local_428._10_4_ & 0xffffff00;
        pSVar29 = (Surface *)&srcLevelStorage;
        viewportCoord.m_data = (float  [2])&local_488;
        texCoord_1.m_data = (float  [2])&local_428;
        tcu::LogImage::LogImage
                  ((LogImage *)&__dnew_1,(string *)&viewportCoord,(string *)&texCoord_1,pSVar29,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&__dnew_1,iVar32,__buf_01,(size_t)pSVar29);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_p != local_308) {
          operator_delete(local_318._M_p,local_308[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__dnew_1 != &local_328) {
          operator_delete((void *)__dnew_1,local_328._M_allocated_capacity + 1);
        }
        if (texCoord_1.m_data != (float  [2])&local_428) {
          operator_delete((void *)texCoord_1.m_data,
                          CONCAT26(local_428._M_allocated_capacity._6_2_,
                                   local_428._M_allocated_capacity._0_6_) + 1);
        }
        if (viewportCoord.m_data != (float  [2])&local_488) {
          operator_delete((void *)viewportCoord.m_data,local_488._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_p != local_1a8) {
          operator_delete(local_1b8._M_p,local_1a8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(res.m_data[1],res.m_data[0]) != &local_1c8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(res.m_data[1],res.m_data[0]),
                          local_1c8._M_allocated_capacity + 1);
        }
        if (texCoords[0].m_data != (float  [2])(texCoords + 2)) {
          operator_delete((void *)texCoords[0].m_data,(long)texCoords[2].m_data + 1);
        }
        if (texCoords_1[0].m_data != (float  [2])(texCoords_1 + 2)) {
          operator_delete((void *)texCoords_1[0].m_data,(long)texCoords_1[2].m_data + 1);
        }
      }
      tcu::TestLog::endImageSet
                (((local_470->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
      bVar37 = iVar16 == 0;
      tcu::Surface::~Surface((Surface *)&srcLevelStorage);
      tcu::Surface::~Surface((Surface *)&res_5);
    }
    else {
      bVar37 = false;
    }
  }
  else {
    lVar19 = 0;
    do {
      local_238.m_size.m_data[lVar19 + -2] = 0x16;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    lVar19 = 3;
    do {
      local_238.m_size.m_data[lVar19 + -2] = 0x10;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 6);
    lVar19 = 0;
    do {
      texCoords_1[0].m_data[lVar19] = 3.08286e-44;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    lVar19 = 3;
    do {
      texCoords_1[0].m_data[lVar19] = 2.24208e-44;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 6);
    texCoords_1[3].m_data[0] = 0.0;
    texCoords_1[3].m_data[1] = 2.24208e-44;
    lowQualityLodPrecision.derivateBits = 0x12;
    lowQualityLodPrecision.rule = lodPrecision.rule;
    local_238.m_format.order = DS;
    local_238.m_format.type = SIGNED_INT_1010102_REV;
    local_238.m_size.m_data[0] = 0;
    local_238.m_size.m_data[1] = 7;
    local_238.m_size.m_data[2] = 7;
    local_238.m_pitch.m_data[0] = 0;
    local_238.m_pitch.m_data[1] = 5;
    local_238.m_pitch.m_data[2] = 0x10;
    local_238.m_data._0_4_ = iVar16 + -1;
    bVar37 = false;
    if ((int)local_238.m_data < 1) {
      local_238.m_data._0_4_ = 0;
    }
    texCoords_1[0].m_data[0] = 2.8026e-44;
    texCoords_1[0].m_data[1] = 2.8026e-44;
    texCoords_1[1].m_data[0] = 0.0;
    texCoords_1[1].m_data[1] = 5.60519e-45;
    texCoords_1[2].m_data[0] = 5.60519e-45;
    texCoords_1[2].m_data[1] = 0.0;
    lowQualityLodPrecision.lodBits = 4;
    if (local_470->m_samplingFunction == SAMPLE_GATHER) {
      res.m_data[0] = 8;
      res.m_data[1] = 3;
      pvVar33 = (void *)(renderedFrame->m_pixels).m_cap;
      if (pvVar33 != (void *)0x0) {
        pvVar33 = (renderedFrame->m_pixels).m_ptr;
      }
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_268,(TextureFormat *)&res,renderedFrame->m_width,
                 renderedFrame->m_height,1,pvVar33);
      pTVar36 = local_470;
      texCoords[0].m_data =
           *(float (*) [2])
            texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
      texCoords[1].m_data =
           *(float (*) [2])
            (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start + 2);
      texCoords[2].m_data =
           *(float (*) [2])
            (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start + 4);
      texCoords[3].m_data =
           *(float (*) [2])
            (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start + 6);
      reference.m_width = 0;
      reference.m_height = 0;
      reference.m_pixels.m_ptr = (void *)0x0;
      reference.m_pixels.m_cap = 0;
      pTVar12 = (local_470->m_texture).
                super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr;
      res.m_data[0] = (pTVar12->m_refTexture).m_view.m_numLevels;
      pCVar28 = (pTVar12->m_refTexture).m_view.m_levels;
      res.m_data[2] = (int)pCVar28;
      res.m_data[3] = (int)((ulong)pCVar28 >> 0x20);
      pSVar3 = &samplerParams->sampler;
      TVar38 = tcu::getEffectiveTextureView
                         ((Texture2DView *)&res,
                          (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                           *)&reference,pSVar3);
      nonShadowBits.m_data._8_8_ = TVar38.m_levels;
      nonShadowBits.m_data[0] = TVar38.m_numLevels;
      pRVar18 = Context::getRenderTarget((pTVar36->super_TestCase).m_context);
      iVar16 = (pRVar18->m_pixelFormat).redBits;
      iVar32 = (pRVar18->m_pixelFormat).greenBits;
      iVar8 = (pRVar18->m_pixelFormat).blueBits;
      iVar9 = (pRVar18->m_pixelFormat).alphaBits;
      effectiveView.m_numLevels =
           CONCAT13(0 < iVar9,CONCAT12(0 < iVar8,CONCAT11(0 < iVar32,0 < iVar16)));
      tcu::Surface::Surface(&errorMask,local_268._8_4_,local_268._12_4_);
      tcu::Surface::Surface((Surface *)&pixelFormat,local_268._8_4_,local_268._12_4_);
      __dnew_1 = 0x300000008;
      if (local_288 != (void *)0x0) {
        local_288 = (void *)pixelFormat._8_8_;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&res,(TextureFormat *)&__dnew_1,pixelFormat.redBits,
                 pixelFormat.greenBits,1,local_288);
      viewportCoord.m_data[0] = -1.7146522e+38;
      tcu::RGBA::toVec((RGBA *)&__dnew_1);
      tcu::clear((PixelBufferAccess *)&res,(Vec4 *)&__dnew_1);
      if (errorMask.m_height < 1) {
        bVar37 = false;
        iVar35 = 0;
      }
      else {
        bVar37 = false;
        iVar34 = 0;
        local_29c = 0;
        do {
          if (0 < errorMask.m_width) {
            iVar35 = 0;
            do {
              __dnew_1 = CONCAT44((float)iVar34,(float)iVar35);
              lVar19 = 0;
              do {
                texCoord_1.m_data[lVar19] = 0.5;
                lVar19 = lVar19 + 1;
              } while (lVar19 == 1);
              res.m_data[0] = 0;
              res.m_data[1] = 0;
              lVar19 = 0;
              do {
                res.m_data[lVar19] =
                     (int)(*(float *)((long)&__dnew_1 + lVar19 * 4) + texCoord_1.m_data[lVar19]);
                lVar19 = lVar19 + 1;
              } while (lVar19 == 1);
              fStack_40c = (float)errorMask.m_height;
              res_5.m_data = (bool  [4])(float)errorMask.m_width;
              viewportCoord.m_data[0] = 0.0;
              viewportCoord.m_data[1] = 0.0;
              lVar19 = 0;
              do {
                viewportCoord.m_data[lVar19] =
                     (float)res.m_data[lVar19] / *(float *)(&res_5)[lVar19].m_data;
                lVar19 = lVar19 + 1;
              } while (lVar19 == 1);
              Functional::(anonymous_namespace)::triQuadInterpolate<tcu::Vector<float,2>>
                        ((_anonymous_namespace_ *)&texCoord_1,&texCoords,viewportCoord.m_data[0],
                         viewportCoord.m_data[1]);
              fVar30 = (samplerParams->super_RenderParams).ref;
              fVar7 = texCoord_1.m_data[0];
              t = texCoord_1.m_data[1];
              paIVar21 = glu::getDefaultGatherOffsets();
              tcu::gatherArray2DOffsetsCompare
                        ((tcu *)&res,(ConstPixelBufferAccess *)nonShadowBits.m_data._8_8_,pSVar3,
                         fVar30,fVar7,t,0,paIVar21);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&__dnew_1,(int)local_268,iVar35,iVar34);
              uVar17 = 0;
              uVar31 = 0;
              if (iVar16 != 0) {
                uVar24 = 0x7e - (res.m_data[0] >> 0x17);
                uVar31 = ((res.m_data[0] & 0x7fffffU) * 0xff + 0x7f800000 >> ((byte)uVar24 & 0x1f))
                         + 0x800000;
                if (8 < uVar24) {
                  uVar31 = uVar24;
                }
                uVar31 = uVar31 >> 0x18;
              }
              if (iVar32 != 0) {
                uVar24 = 0x7e - (res.m_data[1] >> 0x17);
                uVar17 = ((res.m_data[1] & 0x7fffffU) * 0xff + 0x7f800000 >> ((byte)uVar24 & 0x1f))
                         + 0x800000;
                if (8 < uVar24) {
                  uVar17 = uVar24;
                }
                uVar17 = uVar17 >> 0x10 & 0xff00;
              }
              if (iVar8 == 0) {
                uVar24 = 0;
              }
              else {
                uVar25 = 0x7e - (res.m_data[2] >> 0x17);
                uVar24 = ((res.m_data[2] & 0x7fffffU) * 0xff + 0x7f800000 >> ((byte)uVar25 & 0x1f))
                         + 0x800000;
                if (8 < uVar25) {
                  uVar24 = uVar25;
                }
                uVar24 = uVar24 >> 8 & 0xff0000;
              }
              if (iVar9 == 0) {
                uVar25 = 0xff000000;
              }
              else {
                uVar26 = 0x7e - (res.m_data[3] >> 0x17);
                uVar25 = ((res.m_data[3] & 0x7fffffU) * 0xff + 0x7f800000 >> ((byte)uVar26 & 0x1f))
                         + 0x800000;
                if (8 < uVar26) {
                  uVar25 = uVar26;
                }
                uVar25 = uVar25 & 0xff000000;
              }
              *(uint *)((long)errorMask.m_pixels.m_ptr +
                       (long)(errorMask.m_width * iVar34 + iVar35) * 4) =
                   uVar17 | uVar31 | uVar24 | uVar25;
              srcLevelStorage.
              super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((ulong)srcLevelStorage.
                                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                    ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
              lVar19 = 0;
              do {
                *(bool *)((long)&srcLevelStorage.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar19) =
                     (float)res.m_data[lVar19] != *(float *)((long)&__dnew_1 + lVar19 * 4);
                lVar19 = lVar19 + 1;
              } while (lVar19 != 4);
              _res_5 = _res_5 & 0xffffffff00000000;
              lVar19 = 0;
              do {
                res_5.m_data[lVar19] =
                     (bool)(*(byte *)((long)&srcLevelStorage.
                                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar19) &
                           *(byte *)((long)&effectiveView.m_numLevels + lVar19));
                lVar19 = lVar19 + 1;
              } while (lVar19 != 4);
              if (res_5.m_data[0] == false) {
                uVar22 = 0xffffffffffffffff;
                do {
                  if (uVar22 == 2) {
                    uVar27 = 3;
                    break;
                  }
                  uVar27 = uVar22 + 1;
                  lVar19 = uVar22 + 2;
                  uVar22 = uVar27;
                } while (res_5.m_data[lVar19] != true);
                if (uVar27 < 3) goto LAB_01516b4e;
              }
              else {
LAB_01516b4e:
                paIVar21 = glu::getDefaultGatherOffsets();
                bVar15 = tcu::isGatherOffsetsCompareResultValid
                                   ((Texture2DView *)&nonShadowBits,pSVar3,
                                    (TexComparePrecision *)&local_238,&texCoord_1,paIVar21,fVar30,
                                    (Vec4 *)&__dnew_1);
                if (!bVar15) {
                  paIVar21 = glu::getDefaultGatherOffsets();
                  bVar15 = tcu::isGatherOffsetsCompareResultValid
                                     ((Texture2DView *)&nonShadowBits,pSVar3,
                                      (TexComparePrecision *)texCoords_1,&texCoord_1,paIVar21,fVar30
                                      ,(Vec4 *)&__dnew_1);
                  bVar37 = true;
                  if (!bVar15) {
                    *(undefined4 *)
                     (pixelFormat._8_8_ + (long)(pixelFormat.redBits * iVar34 + iVar35) * 4) =
                         0xff0000ff;
                    local_29c = local_29c + 1;
                  }
                }
              }
              iVar35 = iVar35 + 1;
            } while (iVar35 < errorMask.m_width);
          }
          iVar34 = iVar34 + 1;
          iVar35 = local_29c;
        } while (iVar34 < errorMask.m_height);
      }
      pTVar36 = local_470;
      if (iVar35 < 1) {
        if (bVar37) {
          pTVar13 = ((local_470->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar5 = (ostringstream *)(res.m_data + 2);
          res.m_data[0] = (int)pTVar13;
          res.m_data[1] = (int)((ulong)pTVar13 >> 0x20);
          std::__cxx11::ostringstream::ostringstream(poVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar5,
                     "Warning: Verification assuming high-quality PCF filtering failed.",0x41);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar5);
          std::ios_base::~ios_base(local_160);
          __dnew_1 = 0x12;
          res.m_data._0_8_ = &local_1c8;
          pcVar23 = (char *)std::__cxx11::string::_M_create((ulong *)&res,(ulong)&__dnew_1);
          res.m_data[0] = (int)pcVar23;
          res.m_data[1] = (int)((ulong)pcVar23 >> 0x20);
          local_1c8._M_allocated_capacity = __dnew_1;
          builtin_strncpy(pcVar23,"Low-quality result",0x12);
          res.m_data[2] = (int)__dnew_1;
          res.m_data[3] = (int)(__dnew_1 >> 0x20);
          pcVar23[__dnew_1] = '\0';
          tcu::ResultCollector::addResult
                    (&pTVar36->m_result,QP_TEST_RESULT_QUALITY_WARNING,(string *)&res);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(res.m_data[1],res.m_data[0]) != &local_1c8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(res.m_data[1],res.m_data[0]),
                            local_1c8._M_allocated_capacity + 1);
          }
        }
      }
      else {
        pTVar13 = ((local_470->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar5 = (ostringstream *)(res.m_data + 2);
        res.m_data[0] = (int)pTVar13;
        res.m_data[1] = (int)((ulong)pTVar13 >> 0x20);
        std::__cxx11::ostringstream::ostringstream(poVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,"ERROR: Result verification failed, got ",0x27);
        std::ostream::operator<<(poVar5,iVar35);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5," invalid pixels!",0x10);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar5);
        std::ios_base::~ios_base(local_160);
      }
      pTVar13 = ((pTVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      viewportCoord.m_data = (float  [2])&local_488;
      local_488._M_allocated_capacity = 0x6552796669726556;
      local_488._8_4_ = 0x746c7573;
      local_488._M_local_buf[0xc] = '\0';
      texCoord_1.m_data = (float  [2])&local_428;
      res.m_data[0] = 0x13;
      res.m_data[1] = 0;
      texCoord_1.m_data =
           (float  [2])std::__cxx11::string::_M_create((ulong *)&texCoord_1,(ulong)&res);
      local_428._M_allocated_capacity._0_6_ = (undefined6)CONCAT44(res.m_data[1],res.m_data[0]);
      local_428._M_allocated_capacity._6_2_ = (undefined2)((uint)res.m_data[1] >> 0x10);
      *(undefined8 *)texCoord_1.m_data = 0x6163696669726556;
      builtin_strncpy((char *)((long)texCoord_1.m_data + 8),"tion res",8);
      builtin_strncpy((char *)((long)texCoord_1.m_data + 0xf),"sult",4);
      *(char *)((long)texCoord_1.m_data + CONCAT44(res.m_data[1],res.m_data[0])) = '\0';
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)&__dnew_1,(string *)&viewportCoord,(string *)&texCoord_1);
      tcu::TestLog::startImageSet(pTVar13,(char *)__dnew_1,local_318._M_p);
      local_400._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_400._M_allocated_capacity._6_2_ = 0x6465;
      local_400._M_local_buf[8] = '\0';
      ppCVar6 = &srcLevelStorage.
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      srcLevelStorage.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_6_ = 0x7265646e6552;
      srcLevelStorage.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ = 0x6465;
      srcLevelStorage.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0xe;
      pCVar28 = (ConstPixelBufferAccess *)local_268;
      _res_5 = (pointer)&local_400;
      srcLevelStorage.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)ppCVar6;
      tcu::LogImage::LogImage
                ((LogImage *)&res,(string *)&res_5,(string *)&srcLevelStorage,pCVar28,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&res,(int)pTVar13,__buf_02,(size_t)pCVar28);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_p != local_1a8) {
        operator_delete(local_1b8._M_p,local_1a8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(res.m_data[1],res.m_data[0]) != &local_1c8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(res.m_data[1],res.m_data[0]),local_1c8._M_allocated_capacity + 1
                       );
      }
      if (srcLevelStorage.
          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppCVar6) {
        operator_delete(srcLevelStorage.
                        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        CONCAT26(srcLevelStorage.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_,
                                 srcLevelStorage.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_res_5 != &local_400) {
        operator_delete(_res_5,CONCAT26(local_400._M_allocated_capacity._6_2_,
                                        local_400._M_allocated_capacity._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_p != local_308) {
        operator_delete(local_318._M_p,local_308[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__dnew_1 != &local_328) {
        operator_delete((void *)__dnew_1,local_328._M_allocated_capacity + 1);
      }
      if (texCoord_1.m_data != (float  [2])&local_428) {
        operator_delete((void *)texCoord_1.m_data,
                        CONCAT26(local_428._M_allocated_capacity._6_2_,
                                 local_428._M_allocated_capacity._0_6_) + 1);
      }
      if (viewportCoord.m_data != (float  [2])&local_488) {
        operator_delete((void *)viewportCoord.m_data,local_488._M_allocated_capacity + 1);
      }
      if (0 < iVar35) {
        pTVar13 = ((local_470->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        viewportCoord.m_data = (float  [2])&local_488;
        local_488._M_allocated_capacity = 0x636e657265666552;
        local_488._8_2_ = 0x65;
        texCoord_1.m_data = (float  [2])&local_428;
        __dnew_1 = 0x15;
        texCoord_1.m_data =
             (float  [2])std::__cxx11::string::_M_create((ulong *)&texCoord_1,(ulong)&__dnew_1);
        local_428._M_allocated_capacity._0_6_ = (undefined6)__dnew_1;
        local_428._M_allocated_capacity._6_2_ = (undefined2)(__dnew_1 >> 0x30);
        *(undefined8 *)texCoord_1.m_data = 0x6572206c61656449;
        builtin_strncpy((char *)((long)texCoord_1.m_data + 8),"ference ",8);
        builtin_strncpy((char *)((long)texCoord_1.m_data + 0xd),"ce image",8);
        *(char *)((long)texCoord_1.m_data + __dnew_1) = '\0';
        pSVar29 = &errorMask;
        tcu::LogImage::LogImage
                  ((LogImage *)&res,(string *)&viewportCoord,(string *)&texCoord_1,pSVar29,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        iVar16 = (int)pTVar13;
        tcu::LogImage::write((LogImage *)&res,iVar16,__buf_03,(size_t)pSVar29);
        local_400._M_allocated_capacity._0_6_ = 0x4d726f727245;
        local_400._M_allocated_capacity._6_2_ = 0x7361;
        local_400._M_local_buf[8] = 'k';
        local_400._M_local_buf[9] = '\0';
        srcLevelStorage.
        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_6_ = 0x20726f727245;
        srcLevelStorage.
        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ = 0x616d;
        srcLevelStorage.
        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xa;
        pSVar29 = (Surface *)&pixelFormat;
        _res_5 = (pointer)&local_400;
        srcLevelStorage.
        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)ppCVar6;
        tcu::LogImage::LogImage
                  ((LogImage *)&__dnew_1,(string *)&res_5,(string *)&srcLevelStorage,pSVar29,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&__dnew_1,iVar16,__buf_04,(size_t)pSVar29);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_p != local_308) {
          operator_delete(local_318._M_p,local_308[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__dnew_1 != &local_328) {
          operator_delete((void *)__dnew_1,local_328._M_allocated_capacity + 1);
        }
        if (srcLevelStorage.
            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)ppCVar6) {
          operator_delete(srcLevelStorage.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          CONCAT26(srcLevelStorage.
                                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_,
                                   srcLevelStorage.
                                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_res_5 != &local_400) {
          operator_delete(_res_5,CONCAT26(local_400._M_allocated_capacity._6_2_,
                                          local_400._M_allocated_capacity._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_p != local_1a8) {
          operator_delete(local_1b8._M_p,local_1a8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(res.m_data[1],res.m_data[0]) != &local_1c8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(res.m_data[1],res.m_data[0]),
                          local_1c8._M_allocated_capacity + 1);
        }
        if (texCoord_1.m_data != (float  [2])&local_428) {
          operator_delete((void *)texCoord_1.m_data,
                          CONCAT26(local_428._M_allocated_capacity._6_2_,
                                   local_428._M_allocated_capacity._0_6_) + 1);
        }
        if (viewportCoord.m_data != (float  [2])&local_488) {
          operator_delete((void *)viewportCoord.m_data,local_488._M_allocated_capacity + 1);
        }
      }
      tcu::TestLog::endImageSet
                (((local_470->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
      tcu::Surface::~Surface((Surface *)&pixelFormat);
      tcu::Surface::~Surface(&errorMask);
      if (reference._0_8_ != 0) {
        operator_delete((void *)reference._0_8_,reference.m_pixels.m_cap - reference._0_8_);
      }
      bVar37 = iVar35 == 0;
    }
    else if (local_470->m_samplingFunction == SAMPLE_FILTER) {
      res.m_data[0] = 8;
      res.m_data[1] = 3;
      pvVar33 = (void *)(renderedFrame->m_pixels).m_cap;
      if (pvVar33 != (void *)0x0) {
        pvVar33 = (renderedFrame->m_pixels).m_ptr;
      }
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_268,(TextureFormat *)&res,renderedFrame->m_width,
                 renderedFrame->m_height,1,pvVar33);
      pfVar14 = texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      pRVar18 = Context::getRenderTarget((pTVar36->super_TestCase).m_context);
      pixelFormat.redBits = (pRVar18->m_pixelFormat).redBits;
      pixelFormat.greenBits = (pRVar18->m_pixelFormat).greenBits;
      pixelFormat._8_8_ = *(undefined8 *)&(pRVar18->m_pixelFormat).blueBits;
      __dnew_1 = pixelFormat._0_8_;
      pCStack_330 = (ConstPixelBufferAccess *)pixelFormat._8_8_;
      lVar19 = 0;
      do {
        texCoords[0].m_data[lVar19] = 1.4013e-45;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 4);
      res.m_data[0] = 0;
      res.m_data[1] = 0;
      res.m_data[2] = 0;
      res.m_data[3] = 0;
      lVar19 = 0;
      do {
        res.m_data[lVar19] =
             *(int *)((long)&__dnew_1 + lVar19 * 4) - (int)texCoords[0].m_data[lVar19];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 4);
      viewportCoord.m_data[0] = 0.0;
      viewportCoord.m_data[1] = 0.0;
      nonShadowBits.m_data[0] = 0;
      nonShadowBits.m_data[1] = 0;
      nonShadowBits.m_data[2] = 0;
      nonShadowBits.m_data[3] = 0;
      lVar19 = 0;
      do {
        fVar30 = viewportCoord.m_data[lVar19];
        if ((int)viewportCoord.m_data[lVar19] < res.m_data[lVar19]) {
          fVar30 = (float)res.m_data[lVar19];
        }
        nonShadowBits.m_data[lVar19] = (int)fVar30;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 4);
      tcu::computeFixedPointThreshold((tcu *)&res,&nonShadowBits);
      nonShadowThreshold.m_data[1] = (float)res.m_data[2];
      nonShadowThreshold.m_data[0] = (float)res.m_data[1];
      nonShadowThreshold.m_data[2] = (float)res.m_data[3];
      srcLevelStorage.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      srcLevelStorage.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      srcLevelStorage.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_6_ = 0;
      srcLevelStorage.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ = 0;
      pTVar12 = (pTVar36->m_texture).
                super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr;
      res.m_data[0] = (pTVar12->m_refTexture).m_view.m_numLevels;
      pCVar28 = (pTVar12->m_refTexture).m_view.m_levels;
      res.m_data[2] = (int)pCVar28;
      res.m_data[3] = (int)((ulong)pCVar28 >> 0x20);
      TVar38 = tcu::getEffectiveTextureView
                         ((Texture2DView *)&res,&srcLevelStorage,&samplerParams->sampler);
      effectiveView.m_levels = TVar38.m_levels;
      effectiveView.m_numLevels = TVar38.m_numLevels;
      tcu::Surface::Surface(&reference,local_268._8_4_,local_268._12_4_);
      tcu::Surface::Surface(&errorMask,local_268._8_4_,local_268._12_4_);
      tcu::SurfaceAccess::SurfaceAccess((SurfaceAccess *)&res,&reference,&pixelFormat);
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)&res,&effectiveView,pfVar14,samplerParams);
      __dnew_1 = 0x300000008;
      pvVar33 = (void *)reference.m_pixels.m_cap;
      if (reference.m_pixels.m_cap != 0) {
        pvVar33 = reference.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&res,(TextureFormat *)&__dnew_1,reference.m_width,
                 reference.m_height,1,pvVar33);
      texCoords[0].m_data[0] = 1.12104e-44;
      texCoords[0].m_data[1] = 4.2039e-45;
      pvVar33 = (void *)errorMask.m_pixels.m_cap;
      if (errorMask.m_pixels.m_cap != 0) {
        pvVar33 = errorMask.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&__dnew_1,(TextureFormat *)texCoords,errorMask.m_width,
                 errorMask.m_height,1,pvVar33);
      iVar16 = glu::TextureTestUtil::computeTextureCompareDiff
                         ((ConstPixelBufferAccess *)local_268,(ConstPixelBufferAccess *)&res,
                          (PixelBufferAccess *)&__dnew_1,&effectiveView,pfVar14,samplerParams,
                          (TexComparePrecision *)&local_238,&lodPrecision,&nonShadowThreshold);
      if (0 < iVar16) {
        pTVar13 = ((pTVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar5 = (ostringstream *)(res.m_data + 2);
        res.m_data[0] = (int)pTVar13;
        res.m_data[1] = (int)((ulong)pTVar13 >> 0x20);
        std::__cxx11::ostringstream::ostringstream(poVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,
                   "Warning: Verification assuming high-quality PCF filtering failed.",0x41);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar5);
        std::ios_base::~ios_base(local_160);
        __dnew_1 = 0x300000008;
        pvVar33 = (void *)reference.m_pixels.m_cap;
        if (reference.m_pixels.m_cap != 0) {
          pvVar33 = reference.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&res,(TextureFormat *)&__dnew_1,reference.m_width,
                   reference.m_height,1,pvVar33);
        pTVar36 = local_470;
        texCoords[0].m_data[0] = 1.12104e-44;
        texCoords[0].m_data[1] = 4.2039e-45;
        if (errorMask.m_pixels.m_cap != 0) {
          errorMask.m_pixels.m_cap = (size_t)errorMask.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&__dnew_1,(TextureFormat *)texCoords,errorMask.m_width,
                   errorMask.m_height,1,(void *)errorMask.m_pixels.m_cap);
        iVar16 = glu::TextureTestUtil::computeTextureCompareDiff
                           ((ConstPixelBufferAccess *)local_268,(ConstPixelBufferAccess *)&res,
                            (PixelBufferAccess *)&__dnew_1,&effectiveView,pfVar14,samplerParams,
                            (TexComparePrecision *)texCoords_1,&lowQualityLodPrecision,
                            &nonShadowThreshold);
        if (iVar16 < 1) {
          if (((pTVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_testResult ==
              QP_TEST_RESULT_PASS) {
            res.m_data._0_8_ = &local_1c8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&res,"Low-quality result","");
            tcu::ResultCollector::addResult
                      (&pTVar36->m_result,QP_TEST_RESULT_QUALITY_WARNING,(string *)&res);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)res.m_data._0_8_ != &local_1c8) {
              operator_delete((void *)res.m_data._0_8_,local_1c8._M_allocated_capacity + 1);
            }
          }
        }
        else {
          pTVar13 = ((pTVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar5 = (ostringstream *)(res.m_data + 2);
          res.m_data[0] = (int)pTVar13;
          res.m_data[1] = (int)((ulong)pTVar13 >> 0x20);
          std::__cxx11::ostringstream::ostringstream(poVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar5,
                     "ERROR: Verification against low precision requirements failed, failing test case."
                     ,0x51);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar5);
          std::ios_base::~ios_base(local_160);
        }
      }
      if (0 < iVar16) {
        pTVar13 = ((pTVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar5 = (ostringstream *)(res.m_data + 2);
        res.m_data[0] = (int)pTVar13;
        res.m_data[1] = (int)((ulong)pTVar13 >> 0x20);
        std::__cxx11::ostringstream::ostringstream(poVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,"ERROR: Result verification failed, got ",0x27);
        std::ostream::operator<<(poVar5,iVar16);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5," invalid pixels!",0x10);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar5);
        std::ios_base::~ios_base(local_160);
      }
      pTVar13 = ((pTVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      texCoords[0].m_data = (float  [2])(texCoords + 2);
      texCoords[2].m_data[0] = 1.8314912e+25;
      texCoords[2].m_data[1] = 6.2121023e+22;
      texCoords[1].m_data[0] = 1.68156e-44;
      texCoords[1].m_data[1] = 0.0;
      texCoords[3].m_data._0_5_ = 0x746c7573;
      viewportCoord.m_data = (float  [2])&local_488;
      res.m_data[0] = 0x13;
      res.m_data[1] = 0;
      viewportCoord.m_data =
           (float  [2])std::__cxx11::string::_M_create((ulong *)&viewportCoord,(ulong)&res);
      local_488._M_allocated_capacity = CONCAT44(res.m_data[1],res.m_data[0]);
      *(undefined8 *)viewportCoord.m_data = 0x6163696669726556;
      builtin_strncpy((char *)((long)viewportCoord.m_data + 8),"tion res",8);
      builtin_strncpy((char *)((long)viewportCoord.m_data + 0xf),"sult",4);
      *(char *)((long)viewportCoord.m_data + local_488._M_allocated_capacity) = '\0';
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)&__dnew_1,(string *)texCoords,(string *)&viewportCoord);
      tcu::TestLog::startImageSet(pTVar13,(char *)__dnew_1,local_318._M_p);
      local_428._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_428._M_allocated_capacity._6_2_ = 0x6465;
      local_428._M_local_buf[8] = '\0';
      local_400._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_400._M_allocated_capacity._6_2_ = 0x6465;
      local_400._M_local_buf[8] = ' ';
      local_400._M_local_buf[9] = 'i';
      local_400._10_4_ = 0x6567616d;
      local_400._M_local_buf[0xe] = '\0';
      pCVar28 = (ConstPixelBufferAccess *)local_268;
      texCoord_1.m_data = (float  [2])&local_428;
      _res_5 = (pointer)&local_400;
      tcu::LogImage::LogImage
                ((LogImage *)&res,(string *)&texCoord_1,(string *)&res_5,pCVar28,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&res,(int)pTVar13,__buf_05,(size_t)pCVar28);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_p != local_1a8) {
        operator_delete(local_1b8._M_p,local_1a8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(res.m_data[1],res.m_data[0]) != &local_1c8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(res.m_data[1],res.m_data[0]),local_1c8._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_res_5 != &local_400) {
        operator_delete(_res_5,CONCAT26(local_400._M_allocated_capacity._6_2_,
                                        local_400._M_allocated_capacity._0_6_) + 1);
      }
      if (texCoord_1.m_data != (float  [2])&local_428) {
        operator_delete((void *)texCoord_1.m_data,
                        CONCAT26(local_428._M_allocated_capacity._6_2_,
                                 local_428._M_allocated_capacity._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_p != local_308) {
        operator_delete(local_318._M_p,local_308[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__dnew_1 != &local_328) {
        operator_delete((void *)__dnew_1,local_328._M_allocated_capacity + 1);
      }
      if (viewportCoord.m_data != (float  [2])&local_488) {
        operator_delete((void *)viewportCoord.m_data,local_488._M_allocated_capacity + 1);
      }
      if (texCoords[0].m_data != (float  [2])(texCoords + 2)) {
        operator_delete((void *)texCoords[0].m_data,(long)texCoords[2].m_data + 1);
      }
      if (0 < iVar16) {
        pTVar13 = ((local_470->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        texCoords[0].m_data = (float  [2])(texCoords + 2);
        texCoords[2].m_data[0] = 6.8000833e+22;
        texCoords[2].m_data[1] = 4.397635e+21;
        texCoords[3].m_data[0]._0_2_ = 0x65;
        texCoords[1].m_data[0] = 1.26117e-44;
        texCoords[1].m_data[1] = 0.0;
        viewportCoord.m_data = (float  [2])&local_488;
        __dnew_1 = 0x15;
        viewportCoord.m_data =
             (float  [2])std::__cxx11::string::_M_create((ulong *)&viewportCoord,(ulong)&__dnew_1);
        local_488._M_allocated_capacity = __dnew_1;
        *(undefined8 *)viewportCoord.m_data = 0x6572206c61656449;
        builtin_strncpy((char *)((long)viewportCoord.m_data + 8),"ference ",8);
        builtin_strncpy((char *)((long)viewportCoord.m_data + 0xd),"ce image",8);
        *(char *)((long)viewportCoord.m_data + __dnew_1) = '\0';
        pSVar29 = &reference;
        tcu::LogImage::LogImage
                  ((LogImage *)&res,(string *)texCoords,(string *)&viewportCoord,pSVar29,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        iVar32 = (int)pTVar13;
        tcu::LogImage::write((LogImage *)&res,iVar32,__buf_06,(size_t)pSVar29);
        local_428._M_allocated_capacity._0_6_ = 0x4d726f727245;
        local_428._M_allocated_capacity._6_2_ = 0x7361;
        local_428._M_local_buf[8] = 'k';
        local_428._M_local_buf[9] = '\0';
        local_400._M_allocated_capacity._0_6_ = 0x20726f727245;
        local_400._M_allocated_capacity._6_2_ = 0x616d;
        local_400._M_local_buf[8] = 's';
        local_400._M_local_buf[9] = 'k';
        local_400._10_4_ = local_400._10_4_ & 0xffffff00;
        pSVar29 = &errorMask;
        texCoord_1.m_data = (float  [2])&local_428;
        _res_5 = (pointer)&local_400;
        tcu::LogImage::LogImage
                  ((LogImage *)&__dnew_1,(string *)&texCoord_1,(string *)&res_5,pSVar29,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&__dnew_1,iVar32,__buf_07,(size_t)pSVar29);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_p != local_308) {
          operator_delete(local_318._M_p,local_308[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__dnew_1 != &local_328) {
          operator_delete((void *)__dnew_1,local_328._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_res_5 != &local_400) {
          operator_delete(_res_5,CONCAT26(local_400._M_allocated_capacity._6_2_,
                                          local_400._M_allocated_capacity._0_6_) + 1);
        }
        if (texCoord_1.m_data != (float  [2])&local_428) {
          operator_delete((void *)texCoord_1.m_data,
                          CONCAT26(local_428._M_allocated_capacity._6_2_,
                                   local_428._M_allocated_capacity._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_p != local_1a8) {
          operator_delete(local_1b8._M_p,local_1a8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(res.m_data[1],res.m_data[0]) != &local_1c8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(res.m_data[1],res.m_data[0]),
                          local_1c8._M_allocated_capacity + 1);
        }
        if (viewportCoord.m_data != (float  [2])&local_488) {
          operator_delete((void *)viewportCoord.m_data,local_488._M_allocated_capacity + 1);
        }
        if (texCoords[0].m_data != (float  [2])(texCoords + 2)) {
          operator_delete((void *)texCoords[0].m_data,(long)texCoords[2].m_data + 1);
        }
      }
      tcu::TestLog::endImageSet
                (((local_470->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
      tcu::Surface::~Surface(&errorMask);
      tcu::Surface::~Surface(&reference);
      if (srcLevelStorage.
          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(srcLevelStorage.
                        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        CONCAT26(srcLevelStorage.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_,
                                 srcLevelStorage.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_6_) -
                        (long)srcLevelStorage.
                              super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar37 = iVar16 == 0;
    }
  }
  if (!bVar37) {
    res.m_data._0_8_ = &local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&res,"Image verification failed","");
    tcu::ResultCollector::fail(&local_470->m_result,(string *)&res);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)res.m_data._0_8_ != &local_1c8) {
      operator_delete((void *)res.m_data._0_8_,local_1c8._M_allocated_capacity + 1);
    }
  }
  if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TextureBorderClampTest::verifyImage (const tcu::Surface&							renderedFrame,
										  const IterationConfig&						config,
										  const glu::TextureTestUtil::ReferenceParams&	samplerParams)
{
	const tcu::PixelFormat	pixelFormat		= m_context.getRenderTarget().getPixelFormat();

	tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
	std::vector<float>		texCoord;
	bool					verificationOk;

	glu::TextureTestUtil::computeQuadTexCoord2D(texCoord, config.p0, config.p1);

	lodPrecision.derivateBits		= 18;
	lodPrecision.lodBits			= 5;

	if (samplerParams.sampler.compare == tcu::Sampler::COMPAREMODE_NONE)
	{
		const tcu::TextureFormat		texFormat			= tcu::getEffectiveDepthStencilTextureFormat(m_texture->getRefTexture().getFormat(), m_sampleMode);
		const bool						isNearestMinFilter	= samplerParams.sampler.minFilter == tcu::Sampler::NEAREST || samplerParams.sampler.minFilter == tcu::Sampler::NEAREST_MIPMAP_NEAREST;
		const bool						isNearestMagFilter	= samplerParams.sampler.magFilter == tcu::Sampler::NEAREST;
		const bool						isNearestOnly		= isNearestMinFilter && isNearestMagFilter;
		const bool						isSRGB				= texFormat.order == tcu::TextureFormat::sRGB || texFormat.order == tcu::TextureFormat::sRGBA;
		const int						colorErrorBits		= (isNearestOnly && !isSRGB) ? (1) : (2);
		const tcu::IVec4				colorBits			= tcu::max(glu::TextureTestUtil::getBitsVec(pixelFormat) - tcu::IVec4(colorErrorBits), tcu::IVec4(0));
		tcu::LookupPrecision			lookupPrecision;

		lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / samplerParams.colorScale;
		lookupPrecision.coordBits		= tcu::IVec3(20,20,0);
		lookupPrecision.uvwBits			= tcu::IVec3(5,5,0);
		lookupPrecision.colorMask		= glu::TextureTestUtil::getCompareMask(pixelFormat);

		if (m_samplingFunction == SAMPLE_FILTER)
		{
			verificationOk = verifyTextureSampleResult(renderedFrame.getAccess(),
													   &texCoord[0],
													   samplerParams,
													   lodPrecision,
													   lookupPrecision);
		}
		else if (m_samplingFunction == SAMPLE_GATHER)
		{
			verificationOk = verifyTextureGatherResult(renderedFrame.getAccess(),
													   &texCoord[0],
													   samplerParams,
													   lookupPrecision);
		}
		else
		{
			DE_ASSERT(false);
			verificationOk = false;
		}
	}
	else
	{
		tcu::TexComparePrecision	texComparePrecision;
		tcu::TexComparePrecision	lowQualityTexComparePrecision;
		tcu::LodPrecision			lowQualityLodPrecision			= lodPrecision;

		texComparePrecision.coordBits					= tcu::IVec3(20,20,0);
		texComparePrecision.uvwBits						= tcu::IVec3(7,7,0);
		texComparePrecision.pcfBits						= 5;
		texComparePrecision.referenceBits				= 16;
		texComparePrecision.resultBits					= de::max(0, pixelFormat.redBits - 1);

		lowQualityTexComparePrecision.coordBits			= tcu::IVec3(20,20,0);
		lowQualityTexComparePrecision.uvwBits			= tcu::IVec3(4,4,0);
		lowQualityTexComparePrecision.pcfBits			= 0;
		lowQualityTexComparePrecision.referenceBits		= 16;
		lowQualityTexComparePrecision.resultBits		= de::max(0, pixelFormat.redBits - 1);

		lowQualityLodPrecision.lodBits					= 4;

		if (m_samplingFunction == SAMPLE_FILTER)
		{
			verificationOk = verifyTextureCompareResult(renderedFrame.getAccess(),
														&texCoord[0],
														samplerParams,
														texComparePrecision,
														lowQualityTexComparePrecision,
														lodPrecision,
														lowQualityLodPrecision);
		}
		else if (m_samplingFunction == SAMPLE_GATHER)
		{
			verificationOk = verifyTextureGatherCmpResult(renderedFrame.getAccess(),
														  &texCoord[0],
														  samplerParams,
														  texComparePrecision,
														  lowQualityTexComparePrecision);
		}
		else
		{
			DE_ASSERT(false);
			verificationOk = false;
		}
	}

	if (!verificationOk)
		m_result.fail("Image verification failed");
}